

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicCreateLut
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2)

{
  int iVar1;
  uint uVar2;
  long extraout_RDX;
  long lVar3;
  uint Entry;
  
  uVar2 = Kit_TruthToGia(pNew,(uint *)pRes,vLeaves->nSize,vCover,vLeaves,0);
  if ((int)uVar2 < 0) {
LAB_0020ff05:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (1 < uVar2) {
    Entry = uVar2 >> 1;
    lVar3 = extraout_RDX;
    if (0 < (long)vLeaves->nSize) {
      lVar3 = 0;
      do {
        if (vLeaves->pArray[lVar3] < 0) goto LAB_0020ff05;
        if (Entry == (uint)vLeaves->pArray[lVar3] >> 1) {
          return uVar2;
        }
        lVar3 = lVar3 + 1;
      } while (vLeaves->nSize != lVar3);
    }
    iVar1 = vMapping2->nSize;
    Vec_IntFillExtra(vMapping,Entry + 1,(int)lVar3);
    if (vMapping->nSize <= (int)Entry) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vMapping->pArray[Entry] = iVar1;
    Vec_IntPush(vMapping2,vLeaves->nSize);
    if (0 < vLeaves->nSize) {
      lVar3 = 0;
      do {
        if (vLeaves->pArray[lVar3] < 0) goto LAB_0020ff05;
        Vec_IntPush(vMapping2,(uint)vLeaves->pArray[lVar3] >> 1);
        lVar3 = lVar3 + 1;
      } while (lVar3 < vLeaves->nSize);
    }
    Vec_IntPush(vMapping2,Entry);
  }
  return uVar2;
}

Assistant:

int Gia_ManFromIfLogicCreateLut( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    int i, iLit, iObjLit1;
    iObjLit1 = Kit_TruthToGia( pNew, (unsigned *)pRes, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
    // do not create LUT in the simple case
    if ( Abc_Lit2Var(iObjLit1) == 0 )
        return iObjLit1;
    Vec_IntForEachEntry( vLeaves, iLit, i )
        if ( Abc_Lit2Var(iObjLit1) == Abc_Lit2Var(iLit) )
            return iObjLit1;
    // write mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(iObjLit1), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
//    Vec_IntForEachEntry( vLeaves, iLit, i )
//        assert( Abc_Lit2Var(iLit) < Abc_Lit2Var(iObjLit1) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLit)  );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iObjLit1) );
    return iObjLit1;
}